

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O2

bool __thiscall QLibraryPrivate::unload(QLibraryPrivate *this,UnloadFlag flag)

{
  QAtomicInt *pQVar1;
  Data *pDVar2;
  QObject *pQVar3;
  bool bVar4;
  QDebug *pQVar5;
  char *t;
  long in_FS_OFFSET;
  undefined1 local_30 [16];
  char *local_20;
  char *local_18;
  
  local_18 = *(char **)(in_FS_OFFSET + 0x28);
  if (((this->pHnd).super_QBasicAtomicPointer<void>._q_value._M_b._M_p != (__pointer_type)0x0) &&
     (0 < (this->libraryUnloadCount).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i)) {
    pQVar1 = &this->libraryUnloadCount;
    LOCK();
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      local_30._8_8_ = &this->mutex;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      QBasicMutex::lock((QBasicMutex *)local_30._8_8_);
      local_20 = (char *)CONCAT71(local_20._1_7_,1);
      pDVar2 = (this->inst).wp.d;
      if (((pDVar2 != (Data *)0x0) &&
          ((pDVar2->strongref)._q_value.super___atomic_base<int>._M_i != 0)) &&
         (pQVar3 = (this->inst).wp.value, pQVar3 != (QObject *)0x0)) {
        (*pQVar3->_vptr_QObject[4])();
      }
      if (flag != NoUnloadSys) {
        bVar4 = unload_sys(this);
        if (!bVar4) {
          QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)(local_30 + 8));
          goto LAB_00435b98;
        }
      }
      lcDebugLibrary();
      if (((byte)lcDebugLibrary::category.super_QLoggingCategory.field_2.bools.enabledDebug._q_value
                 ._M_base._M_i & 1) != 0) {
        QMessageLogger::debug((QMessageLogger *)local_30);
        pQVar5 = QDebug::operator<<((QDebug *)local_30,&this->fileName);
        pQVar5 = QDebug::operator<<(pQVar5,"unloaded library");
        t = "";
        if (flag == NoUnloadSys) {
          t = "(faked)";
        }
        QDebug::operator<<(pQVar5,t);
        QDebug::~QDebug((QDebug *)local_30);
      }
      LOCK();
      (this->libraryRefCount).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (this->libraryRefCount).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
           .super___atomic_base<int>._M_i + -1;
      UNLOCK();
      (this->pHnd).super_QBasicAtomicPointer<void>._q_value._M_b._M_p = (__pointer_type)0x0;
      (this->instanceFactory).super_QBasicAtomicPointer<QObject_*()>._q_value._M_b._M_p =
           (__pointer_type)0x0;
      QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)(local_30 + 8));
      bVar4 = true;
      goto LAB_00435b9a;
    }
  }
LAB_00435b98:
  bVar4 = false;
LAB_00435b9a:
  if (*(char **)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QLibraryPrivate::unload(UnloadFlag flag)
{
    if (!pHnd.loadRelaxed())
        return false;
    if (libraryUnloadCount.loadRelaxed() > 0 && !libraryUnloadCount.deref()) { // only unload if ALL QLibrary instance wanted to
        QMutexLocker locker(&mutex);
        delete inst.data();
        if (flag == NoUnloadSys || unload_sys()) {
            qCDebug(lcDebugLibrary) << fileName << "unloaded library"
                                    << (flag == NoUnloadSys ? "(faked)" : "");
            // when the library is unloaded, we release the reference on it so that 'this'
            // can get deleted
            libraryRefCount.deref();
            pHnd.storeRelaxed(nullptr);
            instanceFactory.storeRelaxed(nullptr);
            return true;
        }
    }

    return false;
}